

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_zlib(stbi__zbuf *a,int parse_header)

{
  int iVar1;
  uint uVar2;
  int in_ESI;
  long in_RDI;
  int type;
  int final;
  int in_stack_0000007c;
  stbi_uc *in_stack_00000080;
  stbi__zhuffman *in_stack_00000088;
  stbi__zbuf *in_stack_000009d8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_ESI == 0) ||
     (iVar1 = stbi__parse_zlib_header((stbi__zbuf *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8)),
     iVar1 != 0)) {
    *(undefined4 *)(in_RDI + 0x10) = 0;
    *(undefined4 *)(in_RDI + 0x18) = 0;
    *(undefined4 *)(in_RDI + 0x14) = 0;
    do {
      uVar2 = stbi__zreceive((stbi__zbuf *)
                             CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                             in_stack_ffffffffffffffdc);
      in_stack_ffffffffffffffe4 =
           stbi__zreceive((stbi__zbuf *)
                          CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          in_stack_ffffffffffffffdc);
      if (in_stack_ffffffffffffffe4 == 0) {
        iVar1 = stbi__parse_uncompressed_block((stbi__zbuf *)CONCAT44(in_ESI,uVar2));
        if (iVar1 == 0) {
          return 0;
        }
      }
      else {
        if (in_stack_ffffffffffffffe4 == 3) {
          return 0;
        }
        if (in_stack_ffffffffffffffe4 == 1) {
          iVar1 = stbi__zbuild_huffman(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = stbi__zbuild_huffman(in_stack_00000088,in_stack_00000080,in_stack_0000007c);
          if (iVar1 == 0) {
            return 0;
          }
        }
        else {
          iVar1 = stbi__compute_huffman_codes(in_stack_000009d8);
          if (iVar1 == 0) {
            return 0;
          }
        }
        iVar1 = stbi__parse_huffman_block
                          ((stbi__zbuf *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
        if (iVar1 == 0) {
          return 0;
        }
      }
    } while (uVar2 == 0);
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int stbi__parse_zlib(stbi__zbuf *a, int parse_header)
{
   int final, type;
   if (parse_header)
      if (!stbi__parse_zlib_header(a)) return 0;
   a->num_bits = 0;
   a->code_buffer = 0;
   a->hit_zeof_once = 0;
   do {
      final = stbi__zreceive(a,1);
      type = stbi__zreceive(a,2);
      if (type == 0) {
         if (!stbi__parse_uncompressed_block(a)) return 0;
      } else if (type == 3) {
         return 0;
      } else {
         if (type == 1) {
            // use fixed code lengths
            if (!stbi__zbuild_huffman(&a->z_length  , stbi__zdefault_length  , STBI__ZNSYMS)) return 0;
            if (!stbi__zbuild_huffman(&a->z_distance, stbi__zdefault_distance,  32)) return 0;
         } else {
            if (!stbi__compute_huffman_codes(a)) return 0;
         }
         if (!stbi__parse_huffman_block(a)) return 0;
      }
   } while (!final);
   return 1;
}